

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void outlet_float(_outlet *x,t_float f)

{
  _outconnect *local_20;
  _outconnect *oc;
  t_float f_local;
  _outlet *x_local;
  
  stackcount = stackcount + 1;
  if (stackcount < 1000) {
    for (local_20 = x->o_connections; local_20 != (_outconnect *)0x0; local_20 = local_20->oc_next)
    {
      pd_float(local_20->oc_to,f);
    }
  }
  else {
    outlet_stackerror(x);
  }
  stackcount = stackcount + -1;
  return;
}

Assistant:

void outlet_float(t_outlet *x, t_float f)
{
    t_outconnect *oc;
    if(++stackcount >= STACKITER)
        outlet_stackerror(x);
    else
    for (oc = x->o_connections; oc; oc = oc->oc_next)
        pd_float(oc->oc_to, f);
    --stackcount;
}